

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O2

void __thiscall Omega_h::MetricEdgeLengths<2,_2>::~MetricEdgeLengths(MetricEdgeLengths<2,_2> *this)

{
  Write<double>::~Write(&(this->metrics).write_);
  Write<double>::~Write((Write<double> *)this);
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}